

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContext.cpp
# Opt level: O0

void __thiscall JsrtContext::Unlink(JsrtContext *this)

{
  code *pcVar1;
  bool bVar2;
  JsrtRuntime *pJVar3;
  JsrtContext *pJVar4;
  undefined4 *puVar5;
  JsrtContext *this_local;
  
  bVar2 = TaggedPointer<JsrtContext>::operator==(&this->previous,(JsrtContext *)0x0);
  if (bVar2) {
    pJVar3 = Memory::WriteBarrierPtr<JsrtRuntime>::operator->(&this->runtime);
    if (pJVar3->contextList == this) {
      pJVar4 = TaggedPointer::operator_cast_to_JsrtContext_((TaggedPointer *)&this->next);
      pJVar3 = Memory::WriteBarrierPtr<JsrtRuntime>::operator->(&this->runtime);
      pJVar3->contextList = pJVar4;
    }
  }
  else {
    pJVar4 = TaggedPointer<JsrtContext>::operator->(&this->previous);
    bVar2 = TaggedPointer<JsrtContext>::operator==(&pJVar4->next,this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtContext.cpp"
                         ,0x36,"(this->previous->next == this)","this->previous->next == this");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pJVar4 = TaggedPointer<JsrtContext>::operator->(&this->previous);
    (pJVar4->next).ptr = (this->next).ptr;
  }
  bVar2 = TaggedPointer<JsrtContext>::operator!=(&this->next,(JsrtContext *)0x0);
  if (bVar2) {
    pJVar4 = TaggedPointer<JsrtContext>::operator->(&this->next);
    bVar2 = TaggedPointer<JsrtContext>::operator==(&pJVar4->previous,this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtContext.cpp"
                         ,0x3c,"(this->next->previous == this)","this->next->previous == this");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pJVar4 = TaggedPointer<JsrtContext>::operator->(&this->next);
    (pJVar4->previous).ptr = (this->previous).ptr;
  }
  return;
}

Assistant:

void JsrtContext::Unlink()
{
    // Unlink from JsrtRuntime JsrtContext list
    if (this->previous == nullptr)
    {
        // Have to check this because if we failed while creating, it might
        // never have gotten linked in to the runtime at all.
        if (this->runtime->contextList == this)
        {
            this->runtime->contextList = this->next;
        }
    }
    else
    {
        Assert(this->previous->next == this);
        this->previous->next = this->next;
    }

    if (this->next != nullptr)
    {
        Assert(this->next->previous == this);
        this->next->previous = this->previous;
    }
}